

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     Combine<duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>,duckdb::QuantileListOperation<double,false>>
               (Vector *source,Vector *target,AggregateInputData *aggr_input_data,idx_t count)

{
  ulong in_RCX;
  AggregateInputData *in_RSI;
  QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> *in_RDI;
  idx_t i;
  QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> **tdata;
  QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> **sdata;
  undefined8 local_38;
  
  FlatVector::GetData<duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>const*>
            ((Vector *)0xaa16f2);
  FlatVector::GetData<duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>*>
            ((Vector *)0xaa1701);
  for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
    QuantileOperation::
    Combine<duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>,duckdb::QuantileListOperation<double,false>>
              ((QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> *)i,in_RDI,in_RSI);
  }
  return;
}

Assistant:

static void Combine(Vector &source, Vector &target, AggregateInputData &aggr_input_data, idx_t count) {
		D_ASSERT(source.GetType().id() == LogicalTypeId::POINTER && target.GetType().id() == LogicalTypeId::POINTER);
		auto sdata = FlatVector::GetData<const STATE_TYPE *>(source);
		auto tdata = FlatVector::GetData<STATE_TYPE *>(target);

		for (idx_t i = 0; i < count; i++) {
			OP::template Combine<STATE_TYPE, OP>(*sdata[i], *tdata[i], aggr_input_data);
		}
	}